

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int declarator(sym_t *s)

{
  token_t *ptVar1;
  int iVar2;
  int iVar3;
  
  ptVar1 = t;
  iVar3 = 0;
  if (t->id == 0x86) {
    strcpy(s->id,t->string);
    last_id = ptVar1->id;
    t = get_token();
    eline = t->line;
    ecolumn = t->column;
    iVar3 = 1;
    iVar2 = t->id;
    while (iVar2 == 0x28) {
      last_id = 0x28;
      t = get_token();
      eline = t->line;
      ecolumn = t->column;
      if (s->function == 0) {
        s->function = 1;
        iVar2 = expect(0x29);
        if (iVar2 == 0) goto LAB_00105ccf;
      }
      else {
        err(E,"\'%s\' declared as a function returning a function",s);
LAB_00105ccf:
        sync();
      }
      iVar2 = t->id;
    }
  }
  return iVar3;
}

Assistant:

int direct_declarator(sym_t* s)
{
    if (t->id == IDENTIFIER)
    {
        strcpy(s->id, t->string);
        next();

        while (/* t->id == '[' || */ t->id == '(' )
        {
            /* if (t->id == '[')
            {
            }
            else */ if (accept('('))
            {

                if (s->function)
                {
                    err(E, "'%s' declared as a function returning a function", s->id);
                    sync(")");
                }
                else
                {
                    s->function = 1;
                    if (expect(')'))
                        ;
                    else
                        sync(")");
                }
            }

        }

        return 1;
    }
    /*
    else if (t->id == '(')
    {
        declarator etc
        if (t->id == '['
    }

    */
    return 0;
}